

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  ushort uVar1;
  uint uVar2;
  BtShared *pBVar3;
  MemPage *pMVar4;
  u8 *puVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  u32 uVar9;
  Pgno *pPVar10;
  u32 uVar11;
  undefined8 uVar12;
  uchar *__src;
  uint uVar13;
  uchar *__dest;
  BtCursor *pBVar14;
  size_t __n;
  uint uVar15;
  uchar *puVar16;
  long lVar17;
  Pgno nextPage;
  DbPage *pDbPage;
  uint local_68;
  uint local_64;
  BtCursor *local_60;
  int local_54;
  uchar *local_50;
  BtShared *local_48;
  int local_3c;
  PgHdr *local_38;
  
  pBVar3 = pCur->pBt;
  pMVar4 = pCur->pPage;
  local_54 = eOp;
  getCellInfo(pCur);
  puVar5 = (pCur->info).pPayload;
  uVar1 = (pCur->info).nLocal;
  uVar15 = (uint)uVar1;
  uVar12 = 0x10968;
  local_48 = pBVar3;
  if ((ulong)(pBVar3->usableSize - uVar15) < (ulong)((long)puVar5 - (long)pMVar4->aData))
  goto LAB_00144a64;
  local_60 = pCur;
  if (uVar15 < offset || uVar15 - offset == 0) {
    uVar15 = offset - uVar1;
    iVar7 = 0;
    local_50 = pBuf;
  }
  else {
    uVar11 = uVar15 - offset;
    if (amt + offset <= (uint)uVar1) {
      uVar11 = amt;
    }
    __n = (size_t)(int)uVar11;
    if (local_54 == 0) {
      memcpy(pBuf,puVar5 + offset,__n);
LAB_00144820:
      iVar7 = 0;
    }
    else {
      iVar7 = sqlite3PagerWrite(pMVar4->pDbPage);
      if (iVar7 == 0) {
        memcpy(puVar5 + offset,pBuf,__n);
        goto LAB_00144820;
      }
    }
    local_50 = pBuf + __n;
    amt = amt - uVar11;
    uVar15 = 0;
  }
  if ((iVar7 == 0) && (amt != 0)) {
    local_64 = local_48->usableSize - 4;
    uVar1 = (local_60->info).nLocal;
    uVar13 = *(uint *)(puVar5 + uVar1);
    local_68 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
    if ((local_60->curFlags & 4) == 0) {
      iVar7 = 0;
      uVar13 = (((local_48->usableSize - (uint)uVar1) + (local_60->info).nPayload) - 5) / local_64;
      if ((local_60->aOverflow != (Pgno *)0x0) &&
         (iVar8 = (*sqlite3Config.m.xSize)(local_60->aOverflow), pBVar14 = local_60,
         (int)(uVar13 * 4) <= iVar8)) {
LAB_001448c9:
        lVar17 = 0;
        memset(pBVar14->aOverflow,0,(long)(int)uVar13 << 2);
        local_60->curFlags = local_60->curFlags | 4;
        goto LAB_0014490f;
      }
      pBVar14 = local_60;
      pPVar10 = (Pgno *)sqlite3Realloc(local_60->aOverflow,(long)(int)(uVar13 * 2) << 2);
      if (pPVar10 != (Pgno *)0x0) {
        pBVar14->aOverflow = pPVar10;
        goto LAB_001448c9;
      }
      iVar8 = 7;
LAB_00144a4e:
      bVar6 = false;
    }
    else {
      lVar17 = 0;
      if (local_60->aOverflow[(ulong)uVar15 / (ulong)local_64] != 0) {
        lVar17 = (long)(int)((ulong)uVar15 / (ulong)local_64);
        local_68 = local_60->aOverflow[lVar17];
        uVar15 = uVar15 % local_64;
      }
LAB_0014490f:
      if (local_68 != 0) {
        local_3c = (uint)(local_54 == 0) * 2;
        pBVar14 = local_60;
        lVar17 = lVar17 * 4;
        uVar13 = local_64;
        do {
          pPVar10 = pBVar14->aOverflow;
          *(uint *)((long)pPVar10 + lVar17) = local_68;
          if (uVar15 < uVar13) {
            uVar11 = uVar13 - uVar15;
            if (amt + uVar15 <= uVar13) {
              uVar11 = amt;
            }
            iVar7 = (*local_48->pPager->xGet)(local_48->pPager,local_68,&local_38,local_3c);
            if (iVar7 == 0) {
              puVar16 = (uchar *)((ulong)(uVar15 + 4) + (long)local_38->pData);
              uVar15 = *local_38->pData;
              local_68 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                         uVar15 << 0x18;
              __src = puVar16;
              __dest = local_50;
              if ((local_54 == 0) ||
                 (iVar7 = sqlite3PagerWrite(local_38), __src = local_50, __dest = puVar16,
                 iVar7 == 0)) {
                memcpy(__dest,__src,(long)(int)uVar11);
                iVar7 = 0;
              }
              uVar15 = 0;
              if (local_38 != (DbPage *)0x0) {
                sqlite3PagerUnrefNotNull(local_38);
              }
            }
            uVar9 = uVar11;
            if (amt == uVar11) {
              uVar9 = 0;
            }
            amt = amt - uVar11;
            iVar8 = iVar7;
            if (amt == 0) goto LAB_00144a4e;
            local_50 = local_50 + (int)uVar9;
            pBVar14 = local_60;
            uVar13 = local_64;
          }
          else {
            uVar2 = *(uint *)((long)pPVar10 + lVar17 + 4);
            if (uVar2 == 0) {
              iVar7 = getOverflowPage(local_48,local_68,(MemPage **)0x0,&local_68);
              pBVar14 = local_60;
              uVar15 = uVar15 - uVar13;
              uVar13 = local_64;
            }
            else {
              iVar7 = 0;
              uVar15 = uVar15 - uVar13;
              local_68 = uVar2;
            }
          }
          if (iVar7 != 0) goto LAB_00144a44;
          lVar17 = lVar17 + 4;
        } while (local_68 != 0);
      }
      iVar7 = 0;
LAB_00144a44:
      iVar8 = 7;
      bVar6 = true;
    }
    if (!bVar6) {
      return iVar8;
    }
  }
  if (iVar7 != 0) {
    return iVar7;
  }
  uVar12 = 0x109f9;
  if (amt == 0) {
    return 0;
  }
LAB_00144a64:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar12,
              "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
  return 0xb;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */ 
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  int iIdx = 0;
  MemPage *pPage = pCur->pPage;               /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  unsigned char * const pBufStart = pBuf;     /* Start of original out buffer */
#endif

  assert( pPage );
  assert( eOp==0 || eOp==1 );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->ix<pPage->nCell );
  assert( cursorHoldsMutex(pCur) );

  getCellInfo(pCur);
  aPayload = pCur->info.pPayload;
  assert( offset+amt <= pCur->info.nPayload );

  assert( aPayload > pPage->aData );
  if( (uptr)(aPayload - pPage->aData) > (pBt->usableSize - pCur->info.nLocal) ){
    /* Trying to read or write past the end of the data is an error.  The
    ** conditional above is really:
    **    &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize]
    ** but is recast into its current form to avoid integer overflow problems
    */
    return SQLITE_CORRUPT_PAGE(pPage);
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, eOp, pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }


  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

    /* If the BtCursor.aOverflow[] has not been allocated, allocate it now.
    **
    ** The aOverflow[] array is sized at one entry for each overflow page
    ** in the overflow chain. The page number of the first overflow page is
    ** stored in aOverflow[0], etc. A value of 0 in the aOverflow[] array
    ** means "not yet known" (the cache is lazily populated).
    */
    if( (pCur->curFlags & BTCF_ValidOvfl)==0 ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      if( pCur->aOverflow==0
       || nOvfl*(int)sizeof(Pgno) > sqlite3MallocSize(pCur->aOverflow)
      ){
        Pgno *aNew = (Pgno*)sqlite3Realloc(
            pCur->aOverflow, nOvfl*2*sizeof(Pgno)
        );
        if( aNew==0 ){
          return SQLITE_NOMEM_BKPT;
        }else{
          pCur->aOverflow = aNew;
        }
      }
      memset(pCur->aOverflow, 0, nOvfl*sizeof(Pgno));
      pCur->curFlags |= BTCF_ValidOvfl;
    }else{
      /* If the overflow page-list cache has been allocated and the
      ** entry for the first required overflow page is valid, skip
      ** directly to it.
      */
      if( pCur->aOverflow[offset/ovflSize] ){
        iIdx = (offset/ovflSize);
        nextPage = pCur->aOverflow[iIdx];
        offset = (offset%ovflSize);
      }
    }

    assert( rc==SQLITE_OK && amt>0 );
    while( nextPage ){
      /* If required, populate the overflow page-list cache. */
      assert( pCur->aOverflow[iIdx]==0
              || pCur->aOverflow[iIdx]==nextPage
              || CORRUPT_DB );
      pCur->aOverflow[iIdx] = nextPage;

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        */
        assert( pCur->curFlags & BTCF_ValidOvfl );
        assert( pCur->pBtree->db==pBt->db );
        if( pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        }else{
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        }
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and 
        **   2) data is required from the start of this overflow page, and
        **   3) there are no dirty pages in the page-cache
        **   4) the database is file-backed, and
        **   5) the page is not in the WAL file
        **   6) at least 4 bytes have already been read into the output buffer 
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( eOp==0                                             /* (1) */
         && offset==0                                          /* (2) */
         && sqlite3PagerDirectReadOk(pBt->pPager, nextPage)    /* (3,4,5) */
         && &pBuf[-4]>=pBufStart                               /* (6) */
        ){
          sqlite3_file *fd = sqlite3PagerFile(pBt->pPager);
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          assert( aWrite>=pBufStart );                         /* due to (6) */
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerGet(pBt->pPager, nextPage, &pDbPage,
              (eOp==0 ? PAGER_GET_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, eOp, pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        if( amt==0 ) return rc;
        pBuf += a;
      }
      if( rc ) break;
      iIdx++;
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    /* Overflow chain ends prematurely */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  return rc;
}